

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_on_fail(intptr_t uuid,void *udata)

{
  pid_t __pid;
  void *udata_local;
  intptr_t uuid_local;
  
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: (facil.io) unknown cluster connection error");
  }
  perror("       errno");
  __pid = fio_parent_pid();
  kill(__pid,2);
  fio_stop();
  return;
}

Assistant:

static void fio_cluster_on_fail(intptr_t uuid, void *udata) {
  FIO_LOG_FATAL("(facil.io) unknown cluster connection error");
  perror("       errno");
  kill(fio_parent_pid(), SIGINT);
  fio_stop();
  // exit(errno ? errno : 1);
  (void)udata;
  (void)uuid;
}